

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

void Bac_ManMoveNames(Bac_Man_t *pNew,Bac_Man_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Bac_Ntk_t *p_01;
  long lVar11;
  Bac_Ntk_t *p_02;
  long local_58;
  ulong local_50;
  
  if (0 < p->nNtks) {
    lVar9 = 1;
    do {
      iVar3 = p->pNtks[lVar9].iCopy;
      if (((long)iVar3 < 1) || (pNew->nNtks < iVar3)) {
        p_01 = (Bac_Ntk_t *)0x0;
      }
      else {
        p_01 = pNew->pNtks + iVar3;
      }
      p_02 = p->pNtks + lVar9;
      if ((p_02->vName).pArray == (int *)0x0) {
        __assert_fail("Bac_NtkHasNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x255,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
      if ((p_01->vName).pArray != (int *)0x0) {
        __assert_fail("!Bac_NtkHasNames(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x256,"void Bac_NtkMoveNames(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
      iVar3 = (p_01->vType).nCap;
      lVar7 = (long)iVar3;
      if (lVar7 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
      }
      p_00 = &p_01->vName;
      if ((p_01->vName).nCap < iVar3) {
        piVar5 = (int *)malloc(lVar7 * 4);
        (p_01->vName).pArray = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_00->nCap = iVar3;
      }
      if (0 < iVar3) {
        memset((p_01->vName).pArray,0,lVar7 << 2);
      }
      (p_01->vName).nSize = iVar3;
      if (0 < (p_02->vInputs).nSize) {
        lVar7 = 0;
        do {
          iVar3 = (p_02->vInputs).pArray[lVar7];
          if (((long)iVar3 < 0) || ((p_02->vCopy).nSize <= iVar3)) goto LAB_008b3815;
          uVar1 = (p_02->vCopy).pArray[iVar3];
          iVar3 = Bac_ObjName(p_02,iVar3);
          iVar4 = Bac_ObjName(p_01,uVar1);
          if (iVar4 != 0) goto LAB_008b3834;
          if (((int)uVar1 < 0) || ((p_01->vType).nSize <= (int)uVar1)) goto LAB_008b37f6;
          if (((p_01->vType).pArray[uVar1] & 0xfcU) == 4) goto LAB_008b3834;
          Vec_IntFillExtra(p_00,uVar1 + 1,0);
          if ((p_01->vName).nSize <= (int)uVar1) goto LAB_008b3872;
          (p_01->vName).pArray[uVar1] = iVar3;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (p_02->vInputs).nSize);
      }
      if (0 < (p_02->vType).nSize) {
        local_58 = 1;
        lVar7 = 0;
        do {
          if (((p_02->vType).pArray[lVar7] & 0xfeU) == 10) {
            if ((p_02->vCopy).nSize <= lVar7) goto LAB_008b3815;
            uVar1 = (p_02->vCopy).pArray[lVar7];
            iVar3 = Bac_ObjName(p_02,(int)lVar7);
            iVar4 = Bac_ObjName(p_01,uVar1);
            if (iVar4 != 0) goto LAB_008b3834;
            if (((int)uVar1 < 0) || ((p_01->vType).nSize <= (int)uVar1)) goto LAB_008b37f6;
            if (((p_01->vType).pArray[uVar1] & 0xfcU) == 4) goto LAB_008b3834;
            Vec_IntFillExtra(p_00,uVar1 + 1,0);
            if ((p_01->vName).nSize <= (int)uVar1) goto LAB_008b3872;
            (p_01->vName).pArray[uVar1] = iVar3;
            lVar11 = local_58;
            if (lVar7 + 1 < (long)(p_02->vType).nSize) {
              do {
                if (((p_02->vType).pArray[lVar11] & 0xfeU) != 8) break;
                if ((p_02->vCopy).nSize <= lVar11) goto LAB_008b3815;
                uVar1 = (p_02->vCopy).pArray[lVar11];
                iVar3 = Bac_ObjName(p_02,(int)lVar11);
                iVar4 = Bac_ObjName(p_01,uVar1);
                if (iVar4 != 0) goto LAB_008b3834;
                if (((int)uVar1 < 0) || ((p_01->vType).nSize <= (int)uVar1)) goto LAB_008b37f6;
                if (((p_01->vType).pArray[uVar1] & 0xfcU) == 4) goto LAB_008b3834;
                Vec_IntFillExtra(p_00,uVar1 + 1,0);
                if ((p_01->vName).nSize <= (int)uVar1) goto LAB_008b3872;
                (p_01->vName).pArray[uVar1] = iVar3;
                lVar11 = lVar11 + 1;
              } while ((int)lVar11 < (p_02->vType).nSize);
            }
          }
          lVar7 = lVar7 + 1;
          local_58 = local_58 + 1;
        } while (lVar7 < (p_02->vType).nSize);
      }
      if (0 < (p_02->vType).nSize) {
        local_50 = 0xffffffffffffffff;
        lVar7 = 0;
        do {
          if ((lVar7 != 0) && (uVar10 = local_50, ((p_02->vType).pArray[lVar7] & 0xfeU) == 10)) {
            do {
              lVar11 = uVar10 + 1;
              iVar3 = (int)lVar11;
              if ((p_02->vType).nSize < iVar3) goto LAB_008b37f6;
              uVar8 = uVar10 & 0xffffffff;
              if (((p_02->vType).pArray[uVar8] & 0xfeU) != 6) break;
              if ((p_02->vCopy).nSize < iVar3) goto LAB_008b3815;
              iVar4 = (p_02->vCopy).pArray[uVar8];
              lVar6 = (long)iVar4;
              if ((lVar6 < 0) || ((p_01->vType).nSize <= iVar4)) goto LAB_008b37f6;
              if (((p_01->vType).pArray[lVar6] & 0xfcU) != 4) goto LAB_008b3853;
              if ((p_01->vFanin).nSize <= iVar4) goto LAB_008b3815;
              iVar4 = Bac_ObjName(p_01,(p_01->vFanin).pArray[lVar6]);
              if (iVar4 == 0) {
                if ((p_02->vCopy).nSize < iVar3) goto LAB_008b3815;
                iVar3 = (p_02->vCopy).pArray[uVar8];
                lVar6 = (long)iVar3;
                if ((lVar6 < 0) || ((p_01->vType).nSize <= iVar3)) goto LAB_008b37f6;
                if (((p_01->vType).pArray[lVar6] & 0xfcU) != 4) goto LAB_008b3853;
                if ((p_01->vFanin).nSize <= iVar3) goto LAB_008b3815;
                uVar1 = (p_01->vFanin).pArray[lVar6];
                iVar3 = Bac_ObjName(p_02,(int)uVar10);
                iVar4 = Bac_ObjName(p_01,uVar1);
                if (iVar4 != 0) goto LAB_008b3834;
                if (((int)uVar1 < 0) || ((p_01->vType).nSize <= (int)uVar1)) goto LAB_008b37f6;
                if (((p_01->vType).pArray[uVar1] & 0xfcU) == 4) goto LAB_008b3834;
                Vec_IntFillExtra(p_00,uVar1 + 1,0);
                if ((p_01->vName).nSize <= (int)uVar1) goto LAB_008b3872;
                (p_01->vName).pArray[uVar1] = iVar3;
              }
              uVar10 = uVar10 - 1;
            } while (1 < lVar11);
          }
          lVar7 = lVar7 + 1;
          local_50 = local_50 + 1;
        } while (lVar7 < (p_02->vType).nSize);
      }
      if (0 < (p_02->vOutputs).nSize) {
        lVar7 = 0;
        do {
          iVar3 = (p_02->vOutputs).pArray[lVar7];
          lVar11 = (long)iVar3;
          if ((lVar11 < 0) || ((p_02->vCopy).nSize <= iVar3)) goto LAB_008b3815;
          iVar4 = (p_02->vCopy).pArray[lVar11];
          lVar6 = (long)iVar4;
          if ((lVar6 < 0) || ((p_01->vType).nSize <= iVar4)) goto LAB_008b37f6;
          if (((p_01->vType).pArray[lVar6] & 0xfcU) != 4) goto LAB_008b3853;
          if ((p_01->vFanin).nSize <= iVar4) goto LAB_008b3815;
          iVar4 = Bac_ObjName(p_01,(p_01->vFanin).pArray[lVar6]);
          if (iVar4 == 0) {
            if ((p_02->vCopy).nSize <= iVar3) {
LAB_008b3815:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = (p_02->vCopy).pArray[lVar11];
            lVar11 = (long)iVar4;
            if ((lVar11 < 0) || ((p_01->vType).nSize <= iVar4)) {
LAB_008b37f6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            if (((p_01->vType).pArray[lVar11] & 0xfcU) != 4) {
LAB_008b3853:
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
            }
            if ((p_01->vFanin).nSize <= iVar4) goto LAB_008b3815;
            uVar1 = (p_01->vFanin).pArray[lVar11];
            iVar3 = Bac_ObjName(p_02,iVar3);
            iVar4 = Bac_ObjName(p_01,uVar1);
            if (iVar4 != 0) {
LAB_008b3834:
              __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
            }
            if (((int)uVar1 < 0) || ((p_01->vType).nSize <= (int)uVar1)) goto LAB_008b37f6;
            if (((p_01->vType).pArray[uVar1] & 0xfcU) == 4) goto LAB_008b3834;
            Vec_IntFillExtra(p_00,uVar1 + 1,0);
            if ((p_01->vName).nSize <= (int)uVar1) {
LAB_008b3872:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p_01->vName).pArray[uVar1] = iVar3;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (p_02->vOutputs).nSize);
      }
      bVar2 = lVar9 < p->nNtks;
      lVar9 = lVar9 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

static inline void Bac_ManMoveNames( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkMoveNames( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
}